

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SolutionNeighbourhood.cpp
# Opt level: O1

Solution * __thiscall SolutionNeighbourhood::getNext(SolutionNeighbourhood *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  Turn *pTVar2;
  pointer ppNVar3;
  NurseSolution *pNVar4;
  Solution *this_00;
  NurseSolution *this_01;
  pointer pcVar5;
  pointer ppNVar6;
  pointer pvVar7;
  bool bVar8;
  int iVar9;
  ulong uVar10;
  vector<Turn_*,_std::allocator<Turn_*>_> *pvVar11;
  Move *pMVar12;
  ShiftType *pSVar13;
  string *psVar14;
  vector<std::vector<Turn_*,_std::allocator<Turn_*>_>,_std::allocator<std::vector<Turn_*,_std::allocator<Turn_*>_>_>_>
  *pvVar15;
  vector<NurseSolution_*,_std::allocator<NurseSolution_*>_> *pvVar16;
  Scenario *this_02;
  WeekData *this_03;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<DayRequirement_*,_std::allocator<DayRequirement_*>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<DayRequirement_*,_std::allocator<DayRequirement_*>_>_>_>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<DayRequirement_*,_std::allocator<DayRequirement_*>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<DayRequirement_*,_std::allocator<DayRequirement_*>_>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  *this_04;
  const_iterator cVar17;
  const_iterator cVar18;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_NurseSolution_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_NurseSolution_*>_>_>
  *pmVar19;
  _Base_ptr p_Var20;
  ulong uVar21;
  __hashtable *__h;
  long lVar22;
  Solution *unaff_R13;
  long lVar23;
  vector<NurseSolution_*,_std::allocator<NurseSolution_*>_> tempVector;
  void *local_138;
  iterator iStack_130;
  NurseSolution **local_128;
  Move *local_118;
  string local_110;
  Position local_f0;
  Position local_c0;
  Position local_90;
  Position local_60;
  
  undoLastMove(this);
  if (this->phase == 0) {
    do {
      pvVar15 = Solution::getTurns(this->solution);
      pTVar2 = *(Turn **)(*(long *)&(pvVar15->
                                    super__Vector_base<std::vector<Turn_*,_std::allocator<Turn_*>_>,_std::allocator<std::vector<Turn_*,_std::allocator<Turn_*>_>_>_>
                                    )._M_impl.super__Vector_impl_data._M_start[this->iterator1].
                                    super__Vector_base<Turn_*,_std::allocator<Turn_*>_>._M_impl.
                                    super__Vector_impl_data + (long)this->iterator2 * 8);
      pvVar16 = Turn::getNurses(pTVar2);
      ppNVar3 = (pvVar16->super__Vector_base<NurseSolution_*,_std::allocator<NurseSolution_*>_>).
                _M_impl.super__Vector_impl_data._M_finish;
      ppNVar6 = (pvVar16->super__Vector_base<NurseSolution_*,_std::allocator<NurseSolution_*>_>).
                _M_impl.super__Vector_impl_data._M_start;
      this_02 = Scenario::getInstance();
      this_03 = Scenario::getWeekData(this_02);
      this_04 = &WeekData::getRequirements_abi_cxx11_(this_03)->_M_h;
      psVar14 = Turn::getSkill_abi_cxx11_(pTVar2);
      cVar17 = std::
               _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<DayRequirement_*,_std::allocator<DayRequirement_*>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<DayRequirement_*,_std::allocator<DayRequirement_*>_>_>_>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<DayRequirement_*,_std::allocator<DayRequirement_*>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<DayRequirement_*,_std::allocator<DayRequirement_*>_>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
               ::find(this_04,psVar14);
      if (cVar17.
          super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<DayRequirement_*,_std::allocator<DayRequirement_*>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<DayRequirement_*,_std::allocator<DayRequirement_*>_>_>_>_>_>,_true>
          ._M_cur == (__node_type *)0x0) {
LAB_00116067:
        std::__throw_out_of_range("_Map_base::at");
LAB_00116073:
        std::__throw_out_of_range_fmt
                  ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
      }
      pSVar13 = Turn::getShiftType(pTVar2);
      psVar14 = ShiftType::getId_abi_cxx11_(pSVar13);
      cVar18 = std::
               _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<DayRequirement_*,_std::allocator<DayRequirement_*>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<DayRequirement_*,_std::allocator<DayRequirement_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
               ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<DayRequirement_*,_std::allocator<DayRequirement_*>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<DayRequirement_*,_std::allocator<DayRequirement_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                       *)((long)cVar17.
                                super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<DayRequirement_*,_std::allocator<DayRequirement_*>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<DayRequirement_*,_std::allocator<DayRequirement_*>_>_>_>_>_>,_true>
                                ._M_cur + 0x28),psVar14);
      if (cVar18.
          super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<DayRequirement_*,_std::allocator<DayRequirement_*>_>_>,_true>
          ._M_cur == (__node_type *)0x0) goto LAB_00116067;
      iVar9 = Turn::getDay(pTVar2);
      if ((ulong)(*(long *)((long)cVar18.
                                  super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<DayRequirement_*,_std::allocator<DayRequirement_*>_>_>,_true>
                                  ._M_cur + 0x30) -
                  *(long *)((long)cVar18.
                                  super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<DayRequirement_*,_std::allocator<DayRequirement_*>_>_>,_true>
                                  ._M_cur + 0x28) >> 3) <= (ulong)(long)iVar9) goto LAB_00116073;
      iVar9 = DayRequirement::getOptimalCoverage
                        (*(DayRequirement **)
                          (*(long *)((long)cVar18.
                                           super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<DayRequirement_*,_std::allocator<DayRequirement_*>_>_>,_true>
                                           ._M_cur + 0x28) + (long)iVar9 * 8));
      if ((ulong)((long)ppNVar3 - (long)ppNVar6 >> 3) < (ulong)(long)iVar9) {
        local_138 = (void *)0x0;
        iStack_130._M_current = (NurseSolution **)0x0;
        local_128 = (NurseSolution **)0x0;
        pmVar19 = Solution::getNurses_abi_cxx11_(this->solution);
        for (p_Var20 = (pmVar19->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
            pmVar19 = Solution::getNurses_abi_cxx11_(this->solution),
            (_Rb_tree_header *)p_Var20 != &(pmVar19->_M_t)._M_impl.super__Rb_tree_header;
            p_Var20 = (_Base_ptr)std::_Rb_tree_increment(p_Var20)) {
          if (iStack_130._M_current == local_128) {
            std::vector<NurseSolution*,std::allocator<NurseSolution*>>::
            _M_realloc_insert<NurseSolution*const&>
                      ((vector<NurseSolution*,std::allocator<NurseSolution*>> *)&local_138,
                       iStack_130,(NurseSolution **)(p_Var20 + 2));
          }
          else {
            *iStack_130._M_current = *(NurseSolution **)(p_Var20 + 2);
            iStack_130._M_current = iStack_130._M_current + 1;
          }
        }
        uVar10 = (ulong)this->iteratorTurn1;
        while (uVar21 = (long)iStack_130._M_current - (long)local_138 >> 3, uVar10 < uVar21) {
          bVar8 = Solution::assignNurseToTurn
                            (this->solution,*(NurseSolution **)((long)local_138 + uVar10 * 8),pTVar2
                            );
          if (bVar8) {
            local_118 = (Move *)operator_new(0x70);
            local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,"");
            Position::Position(&local_90,-1,(ShiftType *)0x0,&local_110);
            iVar9 = Turn::getDay(pTVar2);
            pSVar13 = Turn::getShiftType(pTVar2);
            psVar14 = Turn::getSkill_abi_cxx11_(pTVar2);
            Position::Position(&local_c0,iVar9,pSVar13,psVar14);
            pMVar12 = local_118;
            Move::Move(local_118,&local_90,&local_c0,
                       *(NurseSolution **)((long)local_138 + (long)this->iteratorTurn1 * 8));
            this->lastMove = pMVar12;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_c0.skill._M_dataplus._M_p != &local_c0.skill.field_2) {
              operator_delete(local_c0.skill._M_dataplus._M_p,
                              local_c0.skill.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_90.skill._M_dataplus._M_p != &local_90.skill.field_2) {
              operator_delete(local_90.skill._M_dataplus._M_p,
                              local_90.skill.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_110._M_dataplus._M_p != &local_110.field_2) {
              operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1
                             );
            }
            this->iteratorTurn1 = this->iteratorTurn1 + 1;
            unaff_R13 = this->solution;
            break;
          }
          uVar10 = (long)this->iteratorTurn1 + 1;
          this->iteratorTurn1 = (int)uVar10;
        }
        if (local_138 != (void *)0x0) {
          operator_delete(local_138,(long)local_128 - (long)local_138);
        }
        if (uVar21 <= uVar10) goto LAB_00115fba;
LAB_0011603e:
        bVar8 = false;
      }
      else {
LAB_00115fba:
        this->iteratorTurn1 = 0;
        lVar22 = (long)this->iterator2 + 1;
        this->iterator2 = (int)lVar22;
        pvVar15 = Solution::getTurns(this->solution);
        lVar23 = (long)this->iterator1;
        pvVar7 = (pvVar15->
                 super__Vector_base<std::vector<Turn_*,_std::allocator<Turn_*>_>,_std::allocator<std::vector<Turn_*,_std::allocator<Turn_*>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        bVar8 = true;
        if ((long)*(pointer *)
                   ((long)&pvVar7[lVar23].super__Vector_base<Turn_*,_std::allocator<Turn_*>_>.
                           _M_impl.super__Vector_impl_data + 8) -
            *(long *)&pvVar7[lVar23].super__Vector_base<Turn_*,_std::allocator<Turn_*>_>._M_impl.
                      super__Vector_impl_data >> 3 == lVar22) {
          this->iterator2 = 0;
          this->iterator1 = (int)(lVar23 + 1);
          pvVar15 = Solution::getTurns(this->solution);
          if (((long)(pvVar15->
                     super__Vector_base<std::vector<Turn_*,_std::allocator<Turn_*>_>,_std::allocator<std::vector<Turn_*,_std::allocator<Turn_*>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_finish -
               (long)(pvVar15->
                     super__Vector_base<std::vector<Turn_*,_std::allocator<Turn_*>_>,_std::allocator<std::vector<Turn_*,_std::allocator<Turn_*>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555 -
              (lVar23 + 1) == 0) {
            this->phase = this->phase + 1;
            this->iterator1 = 0;
            this->iterator2 = 0;
            unaff_R13 = getNext(this);
            goto LAB_0011603e;
          }
        }
      }
    } while (bVar8);
  }
  else {
    if ((this->phase == 1) &&
       ((ulong)(long)this->iterator1 <
        (ulong)((long)(this->nurseVector).
                      super__Vector_base<NurseSolution_*,_std::allocator<NurseSolution_*>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)(this->nurseVector).
                      super__Vector_base<NurseSolution_*,_std::allocator<NurseSolution_*>_>._M_impl.
                      super__Vector_impl_data._M_start >> 3))) {
      do {
        uVar10 = (ulong)this->iterator2;
        while (uVar10 < (ulong)((long)(this->nurseVector).
                                      super__Vector_base<NurseSolution_*,_std::allocator<NurseSolution_*>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                                (long)(this->nurseVector).
                                      super__Vector_base<NurseSolution_*,_std::allocator<NurseSolution_*>_>
                                      ._M_impl.super__Vector_impl_data._M_start >> 3)) {
          if (this->iterator1 != (int)uVar10) {
            uVar10 = (ulong)this->iteratorTurn1;
            while (pvVar11 = NurseSolution::getTurns
                                       ((this->nurseVector).
                                        super__Vector_base<NurseSolution_*,_std::allocator<NurseSolution_*>_>
                                        ._M_impl.super__Vector_impl_data._M_start[this->iterator1]),
                  uVar10 < (ulong)((long)(pvVar11->
                                         super__Vector_base<Turn_*,_std::allocator<Turn_*>_>).
                                         _M_impl.super__Vector_impl_data._M_finish -
                                   (long)(pvVar11->
                                         super__Vector_base<Turn_*,_std::allocator<Turn_*>_>).
                                         _M_impl.super__Vector_impl_data._M_start >> 3)) {
              uVar10 = (ulong)this->iteratorTurn2;
              while (pvVar11 = NurseSolution::getTurns
                                         ((this->nurseVector).
                                          super__Vector_base<NurseSolution_*,_std::allocator<NurseSolution_*>_>
                                          ._M_impl.super__Vector_impl_data._M_start[this->iterator2]
                                         ),
                    uVar10 < (ulong)((long)(pvVar11->
                                           super__Vector_base<Turn_*,_std::allocator<Turn_*>_>).
                                           _M_impl.super__Vector_impl_data._M_finish -
                                     (long)(pvVar11->
                                           super__Vector_base<Turn_*,_std::allocator<Turn_*>_>).
                                           _M_impl.super__Vector_impl_data._M_start >> 3)) {
                pvVar11 = NurseSolution::getTurns
                                    ((this->nurseVector).
                                     super__Vector_base<NurseSolution_*,_std::allocator<NurseSolution_*>_>
                                     ._M_impl.super__Vector_impl_data._M_start[this->iterator1]);
                pTVar2 = (pvVar11->super__Vector_base<Turn_*,_std::allocator<Turn_*>_>)._M_impl.
                         super__Vector_impl_data._M_start[this->iteratorTurn1];
                pvVar11 = NurseSolution::getTurns
                                    ((this->nurseVector).
                                     super__Vector_base<NurseSolution_*,_std::allocator<NurseSolution_*>_>
                                     ._M_impl.super__Vector_impl_data._M_start[this->iterator2]);
                if (pTVar2 != (pvVar11->super__Vector_base<Turn_*,_std::allocator<Turn_*>_>)._M_impl
                              .super__Vector_impl_data._M_start[this->iteratorTurn2]) {
                  ppNVar3 = (this->nurseVector).
                            super__Vector_base<NurseSolution_*,_std::allocator<NurseSolution_*>_>.
                            _M_impl.super__Vector_impl_data._M_start;
                  pNVar4 = ppNVar3[this->iterator1];
                  pvVar11 = NurseSolution::getTurns(ppNVar3[this->iterator2]);
                  bVar8 = NurseSolution::hasTurn
                                    (pNVar4,(pvVar11->
                                            super__Vector_base<Turn_*,_std::allocator<Turn_*>_>).
                                            _M_impl.super__Vector_impl_data._M_start
                                            [this->iteratorTurn2]);
                  if (!bVar8) {
                    ppNVar3 = (this->nurseVector).
                              super__Vector_base<NurseSolution_*,_std::allocator<NurseSolution_*>_>.
                              _M_impl.super__Vector_impl_data._M_start;
                    pNVar4 = ppNVar3[this->iterator2];
                    pvVar11 = NurseSolution::getTurns(ppNVar3[this->iterator1]);
                    bVar8 = NurseSolution::hasTurn
                                      (pNVar4,(pvVar11->
                                              super__Vector_base<Turn_*,_std::allocator<Turn_*>_>).
                                              _M_impl.super__Vector_impl_data._M_start
                                              [this->iteratorTurn1]);
                    if (!bVar8) {
                      pMVar12 = (Move *)operator_new(0x70);
                      pvVar11 = NurseSolution::getTurns
                                          ((this->nurseVector).
                                           super__Vector_base<NurseSolution_*,_std::allocator<NurseSolution_*>_>
                                           ._M_impl.super__Vector_impl_data._M_start
                                           [this->iterator1]);
                      iVar9 = Turn::getDay((pvVar11->
                                           super__Vector_base<Turn_*,_std::allocator<Turn_*>_>).
                                           _M_impl.super__Vector_impl_data._M_start
                                           [this->iteratorTurn1]);
                      pvVar11 = NurseSolution::getTurns
                                          ((this->nurseVector).
                                           super__Vector_base<NurseSolution_*,_std::allocator<NurseSolution_*>_>
                                           ._M_impl.super__Vector_impl_data._M_start
                                           [this->iterator1]);
                      pSVar13 = Turn::getShiftType((pvVar11->
                                                                                                      
                                                  super__Vector_base<Turn_*,_std::allocator<Turn_*>_>
                                                  )._M_impl.super__Vector_impl_data._M_start
                                                  [this->iteratorTurn1]);
                      pvVar11 = NurseSolution::getTurns
                                          ((this->nurseVector).
                                           super__Vector_base<NurseSolution_*,_std::allocator<NurseSolution_*>_>
                                           ._M_impl.super__Vector_impl_data._M_start
                                           [this->iterator1]);
                      psVar14 = Turn::getSkill_abi_cxx11_
                                          ((pvVar11->
                                           super__Vector_base<Turn_*,_std::allocator<Turn_*>_>).
                                           _M_impl.super__Vector_impl_data._M_start
                                           [this->iteratorTurn1]);
                      Position::Position(&local_f0,iVar9,pSVar13,psVar14);
                      pvVar11 = NurseSolution::getTurns
                                          ((this->nurseVector).
                                           super__Vector_base<NurseSolution_*,_std::allocator<NurseSolution_*>_>
                                           ._M_impl.super__Vector_impl_data._M_start
                                           [this->iterator2]);
                      iVar9 = Turn::getDay((pvVar11->
                                           super__Vector_base<Turn_*,_std::allocator<Turn_*>_>).
                                           _M_impl.super__Vector_impl_data._M_start
                                           [this->iteratorTurn2]);
                      pvVar11 = NurseSolution::getTurns
                                          ((this->nurseVector).
                                           super__Vector_base<NurseSolution_*,_std::allocator<NurseSolution_*>_>
                                           ._M_impl.super__Vector_impl_data._M_start
                                           [this->iterator2]);
                      pSVar13 = Turn::getShiftType((pvVar11->
                                                                                                      
                                                  super__Vector_base<Turn_*,_std::allocator<Turn_*>_>
                                                  )._M_impl.super__Vector_impl_data._M_start
                                                  [this->iteratorTurn2]);
                      pvVar11 = NurseSolution::getTurns
                                          ((this->nurseVector).
                                           super__Vector_base<NurseSolution_*,_std::allocator<NurseSolution_*>_>
                                           ._M_impl.super__Vector_impl_data._M_start
                                           [this->iterator2]);
                      psVar14 = Turn::getSkill_abi_cxx11_
                                          ((pvVar11->
                                           super__Vector_base<Turn_*,_std::allocator<Turn_*>_>).
                                           _M_impl.super__Vector_impl_data._M_start
                                           [this->iteratorTurn2]);
                      Position::Position(&local_60,iVar9,pSVar13,psVar14);
                      ppNVar3 = (this->nurseVector).
                                super__Vector_base<NurseSolution_*,_std::allocator<NurseSolution_*>_>
                                ._M_impl.super__Vector_impl_data._M_start;
                      Move::Move(pMVar12,&local_f0,&local_60,ppNVar3[this->iterator1],
                                 ppNVar3[this->iterator2]);
                      this->lastMove = pMVar12;
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_60.skill._M_dataplus._M_p != &local_60.skill.field_2) {
                        operator_delete(local_60.skill._M_dataplus._M_p,
                                        local_60.skill.field_2._M_allocated_capacity + 1);
                      }
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_f0.skill._M_dataplus._M_p != &local_f0.skill.field_2) {
                        operator_delete(local_f0.skill._M_dataplus._M_p,
                                        local_f0.skill.field_2._M_allocated_capacity + 1);
                      }
                      this_00 = this->solution;
                      pNVar4 = (this->nurseVector).
                               super__Vector_base<NurseSolution_*,_std::allocator<NurseSolution_*>_>
                               ._M_impl.super__Vector_impl_data._M_start[this->iterator1];
                      pvVar11 = NurseSolution::getTurns(pNVar4);
                      pTVar2 = (pvVar11->super__Vector_base<Turn_*,_std::allocator<Turn_*>_>).
                               _M_impl.super__Vector_impl_data._M_start[this->iteratorTurn1];
                      this_01 = (this->nurseVector).
                                super__Vector_base<NurseSolution_*,_std::allocator<NurseSolution_*>_>
                                ._M_impl.super__Vector_impl_data._M_start[this->iterator2];
                      pvVar11 = NurseSolution::getTurns(this_01);
                      bVar8 = Solution::atomicSwitchNurseTurns
                                        (this_00,pNVar4,pTVar2,this_01,
                                         (pvVar11->
                                         super__Vector_base<Turn_*,_std::allocator<Turn_*>_>).
                                         _M_impl.super__Vector_impl_data._M_start
                                         [this->iteratorTurn2]);
                      if (bVar8) {
                        this->iteratorTurn2 = this->iteratorTurn2 + 1;
                        goto LAB_0011604f;
                      }
                      pMVar12 = this->lastMove;
                      if (pMVar12 != (Move *)0x0) {
                        pcVar5 = (pMVar12->lastPosition).skill._M_dataplus._M_p;
                        paVar1 = &(pMVar12->lastPosition).skill.field_2;
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)pcVar5 != paVar1) {
                          operator_delete(pcVar5,paVar1->_M_allocated_capacity + 1);
                        }
                        pcVar5 = (pMVar12->initialPosition).skill._M_dataplus._M_p;
                        paVar1 = &(pMVar12->initialPosition).skill.field_2;
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)pcVar5 != paVar1) {
                          operator_delete(pcVar5,paVar1->_M_allocated_capacity + 1);
                        }
                        operator_delete(pMVar12,0x70);
                      }
                      this->lastMove = (Move *)0x0;
                    }
                  }
                }
                uVar10 = (long)this->iteratorTurn2 + 1;
                this->iteratorTurn2 = (int)uVar10;
              }
              uVar10 = (long)this->iteratorTurn1 + 1;
              this->iteratorTurn1 = (int)uVar10;
              this->iteratorTurn2 = 0;
            }
          }
          uVar10 = (long)this->iterator2 + 1;
          this->iterator2 = (int)uVar10;
          this->iteratorTurn1 = 0;
        }
        this->iterator2 = 0;
        uVar10 = (long)this->iterator1 + 1;
        this->iterator1 = (int)uVar10;
      } while (uVar10 < (ulong)((long)(this->nurseVector).
                                      super__Vector_base<NurseSolution_*,_std::allocator<NurseSolution_*>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                                (long)(this->nurseVector).
                                      super__Vector_base<NurseSolution_*,_std::allocator<NurseSolution_*>_>
                                      ._M_impl.super__Vector_impl_data._M_start >> 3));
    }
    this->ended = true;
LAB_0011604f:
    unaff_R13 = this->solution;
  }
  return unaff_R13;
}

Assistant:

Solution *SolutionNeighbourhood::getNext(){
    undoLastMove();
    if(phase == 0) {
        while (1) {
            Turn *currentTurn = solution->getTurns()[iterator1][iterator2];

            if (currentTurn->getNurses().size() <
                Scenario::getInstance()->getWeekData().getRequirements().at(currentTurn->getSkill()).at(
                        currentTurn->getShiftType()->getId()).at(currentTurn->getDay())->getOptimalCoverage()) {
                vector<NurseSolution *> tempVector;
                for (auto it = solution->getNurses().begin(); it != solution->getNurses().end(); ++it) {
                    tempVector.push_back(it->second);
                }
                for (; iteratorTurn1 < tempVector.size();) {
                    if (solution->assignNurseToTurn(tempVector[iteratorTurn1], currentTurn)) {
                        lastMove = new Move(Position(-1, nullptr, ""),
                                            Position(currentTurn->getDay(), currentTurn->getShiftType(),
                                                     currentTurn->getSkill()), tempVector[iteratorTurn1]);
                        iteratorTurn1++;
                        return solution;
                    }
                    else iteratorTurn1++;
                }
            }
            iteratorTurn1 = 0;
            iterator2++;
            if (iterator2 == solution->getTurns()[iterator1].size()) {
                iterator2 = 0;
                iterator1++;
                if (iterator1 == solution->getTurns().size()) {
                    phase++;
                    iterator1 = 0;
                    iterator2 = 0;
                    return this->getNext();
                }
            }

        }
    }
    //iterate each nurse then iterate the otherNurses and check if they can trade Turns
    else if(phase == 1){
        for(;iterator1 < this->nurseVector.size();){
            for(;iterator2 < this->nurseVector.size();)
            {
                if(iterator1 != iterator2)
                    for(;iteratorTurn1 < nurseVector[iterator1]->getTurns().size();)
                    {
                        for(;iteratorTurn2 < nurseVector[iterator2]->getTurns().size();){
                            if(nurseVector[iterator1]->getTurns()[iteratorTurn1] != nurseVector[iterator2]->getTurns()[iteratorTurn2]
                                    && !nurseVector[iterator1]->hasTurn(nurseVector[iterator2]->getTurns()[iteratorTurn2]) && !nurseVector[iterator2]->hasTurn(nurseVector[iterator1]->getTurns()[iteratorTurn1])) {
                                lastMove = new Move(
                                        //initial Position
                                        Position(nurseVector[iterator1]->getTurns()[iteratorTurn1]->getDay(),
                                                 nurseVector[iterator1]->getTurns()[iteratorTurn1]->getShiftType(),
                                                 nurseVector[iterator1]->getTurns()[iteratorTurn1]->getSkill()),
                                        //lastPosition Position
                                        Position(nurseVector[iterator2]->getTurns()[iteratorTurn2]->getDay(),
                                                 nurseVector[iterator2]->getTurns()[iteratorTurn2]->getShiftType(),
                                                 nurseVector[iterator2]->getTurns()[iteratorTurn2]->getSkill()),
                                        //Ns1 / Ns2
                                        nurseVector[iterator1], nurseVector[iterator2]);

                                if(solution->atomicSwitchNurseTurns(nurseVector[iterator1],nurseVector[iterator1]->getTurns()[iteratorTurn1],nurseVector[iterator2],nurseVector[iterator2]->getTurns()[iteratorTurn2]))
                                {
                                    iteratorTurn2++;
                                    return solution;
                                    }
                                else {
                                    delete lastMove;
                                    lastMove = nullptr;
                                    iteratorTurn2++;
                                }
                            }
                            else iteratorTurn2++;
                        }
                        iteratorTurn1++;
                        iteratorTurn2 = 0;
                    }
                iterator2++;
                iteratorTurn1 = 0;
            }
            iterator2 = 0;
            iterator1++;
        }
    }
    this->ended = true;
    return solution;
}